

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

GLint __thiscall
gl4cts::TextureViewTestViewSampling::getMaxConformantSampleCount
          (TextureViewTestViewSampling *this,GLenum target,GLenum internalFormat)

{
  RenderContext *pRVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *pvVar6;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  ulong uVar7;
  long lVar8;
  GLint max_conformant_samples;
  GLint isConformant;
  GLint gl_sample_counts;
  int local_3c;
  int local_38;
  int local_34;
  long lVar5;
  
  local_3c = 0;
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar3 = (*pRVar1->_vptr_RenderContext[3])
                    (pRVar1,CONCAT44(in_register_00000034,target),
                     CONCAT44(in_register_00000014,internalFormat));
  lVar5 = CONCAT44(extraout_var,iVar3);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_NV_internalformat_sample_query");
  if (bVar2) {
    local_34 = 0;
    (**(code **)(lVar5 + 0x880))(target,0x8058,0x9380,1,&local_34);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGetInternalformativ() failed for GL_NUM_SAMPLE_COUNTS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x12cb);
    iVar3 = local_34;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (long)local_34) {
      uVar7 = (long)local_34 * 4;
    }
    pvVar6 = operator_new__(uVar7);
    (**(code **)(lVar5 + 0x880))(target,0x8058,0x80a9,iVar3,pvVar6);
    if (0 < local_34) {
      lVar8 = 0;
      do {
        local_38 = 0;
        (**(code **)(lVar5 + 0x870))
                  (target,0x8058,*(undefined4 *)((long)pvVar6 + lVar8 * 4),0x9374,1,&local_38);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glGetInternalformatSampleivNV() call(s) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x12d8);
        if ((local_38 != 0) && (iVar3 = *(int *)((long)pvVar6 + lVar8 * 4), local_3c < iVar3)) {
          local_3c = iVar3;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < local_34);
    }
    operator_delete__(pvVar6);
  }
  else {
    (**(code **)(lVar5 + 0x868))(0x910e,&local_3c);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x12e6);
  }
  return local_3c;
}

Assistant:

glw::GLint TextureViewTestViewSampling::getMaxConformantSampleCount(glw::GLenum target, glw::GLenum internalFormat)
{
	(void)internalFormat;
	glw::GLint max_conformant_samples = 0;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return the max conformant sample count if extension is supported */
	if (m_context.getContextInfo().isExtensionSupported("GL_NV_internalformat_sample_query"))
	{
		glw::GLint gl_sample_counts = 0;
		gl.getInternalformativ(target, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 1, &gl_sample_counts);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed for GL_NUM_SAMPLE_COUNTS pname");

		/* Check and return the first conformant sample count */
		glw::GLint* gl_supported_samples = new glw::GLint[gl_sample_counts];
		if (gl_supported_samples)
		{
			gl.getInternalformativ(target, GL_RGBA8, GL_SAMPLES, gl_sample_counts, gl_supported_samples);

			for (glw::GLint i = 0; i < gl_sample_counts; i++)
			{
				glw::GLint isConformant = 0;
				gl.getInternalformatSampleivNV(target, GL_RGBA8, gl_supported_samples[i], GL_CONFORMANT_NV, 1,
											   &isConformant);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformatSampleivNV() call(s) failed");

				if (isConformant && gl_supported_samples[i] > max_conformant_samples)
				{
					max_conformant_samples = gl_supported_samples[i];
				}
			}
			delete[] gl_supported_samples;
		}
	}
	else
	{
		/* Otherwise return GL_MAX_COLOR_TEXTURE_SAMPLES */
		gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &max_conformant_samples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.");
	}

	return max_conformant_samples;
}